

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraditionalHammerer.cpp
# Opt level: O3

void TraditionalHammerer::hammer_sync
               (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *aggressors,int acts,
               char *d1,char *d2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t j;
  ulong uVar4;
  ulong uVar5;
  pointer ppcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = (long)(aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)acts;
  uVar4 = SUB168(auVar3 / auVar1,0);
  uVar5 = (ulong)(long)acts % uVar5;
  uVar7 = CONCAT71(SUB167(auVar3 / auVar1,1),*d2);
  do {
    clflushopt(*d1);
    clflushopt(*d2);
    rdtscp();
    uVar8 = uVar5 << 0x20 | uVar7;
    uVar7 = CONCAT71((int7)(uVar7 >> 8),*d2);
    rdtscp();
    uVar5 = (uVar5 << 0x20 | uVar7) - uVar8;
  } while (uVar5 < 0x3e9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4 + (uVar4 == 0);
  if (uVar4 < 0xf4241) {
    uVar7 = 0;
    do {
      uVar5 = 0;
      do {
        ppcVar6 = (aggressors->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(aggressors->
                      super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppcVar6;
        if (uVar8 != 0x10) {
          uVar8 = 0;
          do {
            clflushopt(*ppcVar6[uVar8]);
            uVar8 = uVar8 + 1;
            ppcVar6 = (aggressors->
                      super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
          } while (uVar8 < ((long)(aggressors->
                                  super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar6 >> 3)
                           - 2U);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
      do {
        rdtscp();
        uVar9 = uVar8 << 0x20 | uVar5;
        clflushopt(*d1);
        clflushopt(*d2);
        uVar5 = CONCAT71((int7)(uVar5 >> 8),*d2);
        rdtscp();
        uVar8 = (uVar8 << 0x20 | uVar5) - uVar9;
      } while (uVar8 < 0x3e9);
      uVar7 = uVar7 + 1;
    } while (uVar7 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar2,0));
  }
  return;
}

Assistant:

void TraditionalHammerer::hammer_sync(std::vector<volatile char *> &aggressors, int acts,
                                      volatile char *d1, volatile char *d2) {
  size_t ref_rounds = std::max(1UL, acts/aggressors.size());

  // determines how often we are repeating
  size_t agg_rounds = ref_rounds;
  uint64_t before, after;

  (void)*d1;
  (void)*d2;

  // synchronize with the beginning of an interval
  while (true) {
    clflushopt(d1);
    clflushopt(d2);
    mfence();
    before = rdtscp();
    lfence();
    (void)*d1;
    (void)*d2;
    after = rdtscp();
    // check if an ACTIVATE was issued
    if ((after - before) > 1000) {
      break;
    }
  }

  // perform hammering for HAMMER_ROUNDS/ref_rounds times
  for (size_t i = 0; i < HAMMER_ROUNDS/ref_rounds; i++) {
    for (size_t j = 0; j < agg_rounds; j++) {
      for (size_t k = 0; k < aggressors.size() - 2; k++) {
        (void)(*aggressors[k]);
        clflushopt(aggressors[k]);
      }
      mfence();
    }

    // after HAMMER_ROUNDS/ref_rounds times hammering, check for next ACTIVATE
    while (true) {
      mfence();
      lfence();
      before = rdtscp();
      lfence();
      clflushopt(d1);
      (void)*d1;
      clflushopt(d2);
      (void)*d2;
      after = rdtscp();
      lfence();
      // stop if an ACTIVATE was issued
      if ((after - before) > 1000) break;
    }
  }
}